

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2NeverCapture(void)

{
  once_flag *this;
  int iVar1;
  ostream *poVar2;
  LogMessage local_2a0;
  StringPiece local_110;
  undefined1 local_100 [8];
  RE2 re;
  Options opt;
  
  this = &re.named_groups_once_;
  RE2::Options::Options((Options *)this);
  RE2::Options::set_never_capture((Options *)this,true);
  StringPiece::StringPiece(&local_110,"(r)(e)");
  RE2::RE2((RE2 *)local_100,&local_110,(Options *)this);
  iVar1 = RE2::NumberOfCapturingGroups((RE2 *)local_100);
  if (iVar1 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x53d);
    poVar2 = LogMessage::stream(&local_2a0);
    std::operator<<(poVar2,"Check failed: (0) == (re.NumberOfCapturingGroups())");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a0);
  }
  RE2::~RE2((RE2 *)local_100);
  return;
}

Assistant:

TEST(RE2, NeverCapture) {
  RE2::Options opt;
  opt.set_never_capture(true);
  RE2 re("(r)(e)", opt);
  EXPECT_EQ(0, re.NumberOfCapturingGroups());
}